

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  byte bVar1;
  bool bVar2;
  CURLUcode CVar3;
  uint uVar4;
  uint uVar5;
  CURLcode CVar6;
  int iVar7;
  size_t sVar8;
  Curl_handler *pCVar9;
  size_t authlen;
  char *pcVar10;
  byte *pbVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  size_t buflen;
  char *pcVar15;
  char cVar16;
  uint uVar17;
  Curl_URL *pCVar18;
  byte *pbVar19;
  byte bVar20;
  size_t urllen;
  CURLU tmpurl;
  dynbuf enc;
  dynbuf host;
  char schemebuf [41];
  byte *local_128;
  byte *local_118;
  ulong local_110;
  Curl_URL local_108;
  dynbuf local_a8;
  dynbuf local_88;
  int local_68;
  char local_64;
  
  bVar20 = 0;
  local_108.query = (char *)0x0;
  local_108.fragment = (char *)0x0;
  local_108.port = (char *)0x0;
  local_108.path = (char *)0x0;
  local_108.host = (char *)0x0;
  local_108.zoneid = (char *)0x0;
  local_108.password = (char *)0x0;
  local_108.options = (char *)0x0;
  local_108.scheme = (char *)0x0;
  local_108.user = (char *)0x0;
  local_108._80_8_ = 0;
  Curl_dyn_init(&local_88,8000000);
  CVar3 = Curl_junkscan(url,&local_110,(_Bool)((byte)(flags >> 0xb) & 1));
  if (CVar3 != CURLUE_OK) goto LAB_00165cb3;
  sVar8 = Curl_is_absolute_url(url,(char *)&local_68,buflen,(flags & 0x204) != 0);
  if (sVar8 == 0) {
    if ((flags & 0x204) == 0) {
      CVar3 = CURLUE_BAD_SCHEME;
      goto LAB_00165cb3;
    }
    pcVar10 = url;
    if ((flags & 4) != 0) {
      pcVar15 = "https";
      goto LAB_00165ee1;
    }
    bVar2 = false;
LAB_00165f00:
    authlen = strcspn(pcVar10,"/?#");
    local_128 = (byte *)(pcVar10 + authlen);
    local_118 = (byte *)(url + (local_110 - (long)local_128));
    if (authlen == 0) {
      CVar3 = CURLUE_NO_HOST;
      if ((flags >> 10 & 1) == 0) goto LAB_00165cb3;
      CVar6 = Curl_dyn_add(&local_88,"");
      CVar3 = CURLUE_OUT_OF_MEMORY;
      if (CVar6 != CURLE_OK) goto LAB_00165cb3;
    }
    else {
      CVar3 = parse_authority(&local_108,pcVar10,authlen,flags,&local_88,sVar8 != 0);
      if (CVar3 != CURLUE_OK) goto LAB_00165cb3;
      if ((flags >> 9 & 1) != 0 && !bVar2) {
        pcVar10 = Curl_dyn_ptr(&local_88);
        iVar7 = curl_strnequal(pcVar10,"ftp.",4);
        if (iVar7 == 0) {
          iVar7 = curl_strnequal(pcVar10,"dict.",5);
          if (iVar7 == 0) {
            iVar7 = curl_strnequal(pcVar10,"ldap.",5);
            if (iVar7 == 0) {
              iVar7 = curl_strnequal(pcVar10,"imap.",5);
              if (iVar7 == 0) {
                iVar7 = curl_strnequal(pcVar10,"smtp.",5);
                if (iVar7 == 0) {
                  iVar7 = curl_strnequal(pcVar10,"pop3.",5);
                  pcVar10 = "pop3";
                  if (iVar7 == 0) {
                    pcVar10 = "http";
                  }
                }
                else {
                  pcVar10 = "smtp";
                }
              }
              else {
                pcVar10 = "imap";
              }
            }
            else {
              pcVar10 = "ldap";
            }
          }
          else {
            pcVar10 = "dict";
          }
        }
        else {
          pcVar10 = "ftp";
        }
        local_108.scheme = (*Curl_cstrdup)(pcVar10);
        if (local_108.scheme == (char *)0x0) goto LAB_0016634a;
        local_108._80_8_ = local_108._80_8_ | 0x40000;
      }
    }
LAB_00166108:
    pbVar11 = (byte *)strchr((char *)local_128,0x23);
    cVar16 = (char)flags;
    if (pbVar11 != (byte *)0x0) {
      pbVar19 = pbVar11 + -(long)local_128;
      uVar12 = (long)local_118 - (long)pbVar19;
      local_108._80_8_ = local_108._80_8_ | 0x20000;
      local_118 = pbVar19;
      if (1 < uVar12) {
        if (cVar16 < '\0') {
          Curl_dyn_init(&local_a8,8000000);
          CVar3 = urlencode_str(&local_a8,(char *)(pbVar11 + 1),uVar12 - 1,true,false);
          if (CVar3 != CURLUE_OK) goto LAB_00165cb3;
          local_108.fragment = Curl_dyn_ptr(&local_a8);
        }
        else {
          local_108.fragment = (char *)Curl_memdup0((char *)(pbVar11 + 1),uVar12 - 1);
          if (local_108.fragment == (char *)0x0) goto LAB_0016634a;
        }
      }
    }
    pvVar13 = memchr(local_128,0x3f,(size_t)local_118);
    if (pvVar13 != (void *)0x0) {
      pbVar19 = local_128 + (long)local_118;
      if (pbVar11 != (byte *)0x0) {
        pbVar19 = pbVar11;
      }
      uVar12 = (long)pbVar19 - (long)pvVar13;
      local_118 = local_118 + -uVar12;
      local_108._80_8_ = local_108._80_8_ | 0x10000;
      if (uVar12 < 2) {
        local_108.query = (*Curl_cstrdup)("");
      }
      else {
        if (cVar16 < '\0') {
          Curl_dyn_init(&local_a8,8000000);
          CVar3 = urlencode_str(&local_a8,(char *)((long)pvVar13 + 1),uVar12 - 1,true,true);
          if (CVar3 != CURLUE_OK) goto LAB_00165cb3;
          local_108.query = Curl_dyn_ptr(&local_a8);
          goto LAB_001661dd;
        }
        local_108.query = (char *)Curl_memdup0((char *)((long)pvVar13 + 1),uVar12 - 1);
      }
      if (local_108.query == (char *)0x0) goto LAB_0016634a;
    }
LAB_001661dd:
    if (local_118 == (byte *)0x0) goto LAB_00166375;
    if (cVar16 < '\0') {
      Curl_dyn_init(&local_a8,8000000);
      CVar3 = urlencode_str(&local_a8,(char *)local_128,(size_t)local_118,true,false);
      if (CVar3 != CURLUE_OK) goto LAB_00165cb3;
      local_118 = (byte *)Curl_dyn_len(&local_a8);
      local_128 = (byte *)Curl_dyn_ptr(&local_a8);
      local_108.path = (char *)local_128;
    }
    if (local_118 < (byte *)0x2) goto LAB_00166375;
    if ((byte *)local_108.path == (byte *)0x0) {
      local_128 = (byte *)Curl_memdup0((char *)local_128,(size_t)local_118);
      local_108.path = (char *)local_128;
      if (local_128 == (byte *)0x0) goto LAB_0016634a;
    }
    else if (cVar16 < '\0') {
      local_108.path[(long)local_118] = 0;
    }
    if ((flags & 0x10) != 0) {
LAB_00166375:
      local_108.host = Curl_dyn_ptr(&local_88);
      free_urlhandle(u);
      pCVar18 = &local_108;
      for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
        u->scheme = pCVar18->scheme;
        pCVar18 = (Curl_URL *)((long)pCVar18 + ((ulong)bVar20 * -2 + 1) * 8);
        u = (CURLU *)((long)u + (ulong)bVar20 * -0x10 + 8);
      }
      return CURLUE_OK;
    }
    iVar7 = dedotdotify((char *)local_128,(size_t)local_118,&local_a8.bufr);
    if (iVar7 == 0) {
      if ((byte *)local_a8.bufr != (byte *)0x0) {
        (*Curl_cfree)(local_108.path);
        local_108.path = local_a8.bufr;
      }
      goto LAB_00166375;
    }
  }
  else {
    if (local_64 == '\0' && local_68 == 0x656c6966) {
      CVar3 = CURLUE_BAD_FILE_URL;
      if (local_110 < 7) goto LAB_00165cb3;
      local_108.scheme = (*Curl_cstrdup)("file");
      if (local_108.scheme == (char *)0x0) goto LAB_0016634a;
      local_128 = (byte *)(url + 5);
      local_118 = (byte *)(local_110 - 5);
      if ((*local_128 == 0x2f) && (url[6] == '/')) {
        local_128 = (byte *)(url + 7);
        if ((url[7] != 0x2f) &&
           (((0x19 < (byte)((url[7] & 0xdfU) + 0xbf) || ((url[8] != '|' && (url[8] != ':')))) ||
            ((cVar16 = url[9], cVar16 != '\0' && ((cVar16 != '/' && (cVar16 != '\\')))))))) {
          iVar7 = curl_strnequal((char *)local_128,"localhost/",10);
          if ((iVar7 == 0) &&
             (iVar7 = curl_strnequal((char *)local_128,"127.0.0.1/",10), iVar7 == 0))
          goto LAB_00165cb3;
          local_128 = (byte *)(url + 0x10);
        }
        local_118 = (byte *)(url + (local_110 - (long)local_128));
      }
      Curl_dyn_reset(&local_88);
      if (*local_128 == 0x2f) {
        if (((byte)((local_128[1] & 0xdf) + 0xbf) < 0x1a) &&
           ((local_128[2] == 0x7c || (local_128[2] == 0x3a)))) {
          bVar1 = local_128[3];
LAB_00165fcd:
          if (((bVar1 == 0) || (bVar1 == 0x2f)) || (bVar1 == 0x5c)) goto LAB_00165cb3;
        }
      }
      else if (((byte)((*local_128 & 0xdf) + 0xbf) < 0x1a) &&
              ((local_128[1] == 0x7c || (local_128[1] == 0x3a)))) {
        bVar1 = local_128[2];
        goto LAB_00165fcd;
      }
      goto LAB_00166108;
    }
    pcVar10 = url + sVar8;
    uVar4 = 0xfffffffe;
    do {
      pcVar15 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
      uVar17 = uVar4 + 1;
      if (*pcVar15 != '/') break;
      uVar5 = uVar4 + 2;
      uVar4 = uVar17;
    } while (uVar5 < 4);
    pcVar15 = (char *)&local_68;
    pCVar9 = Curl_get_scheme_handler(pcVar15);
    CVar3 = CURLUE_UNSUPPORTED_SCHEME;
    if (((flags & 8) == 0 && pCVar9 == (Curl_handler *)0x0) ||
       (CVar3 = CURLUE_BAD_SLASHES, 2 < uVar17)) goto LAB_00165cb3;
LAB_00165ee1:
    local_108.scheme = (*Curl_cstrdup)(pcVar15);
    bVar2 = true;
    if (local_108.scheme != (char *)0x0) goto LAB_00165f00;
  }
LAB_0016634a:
  CVar3 = CURLUE_OUT_OF_MEMORY;
LAB_00165cb3:
  Curl_dyn_free(&local_88);
  free_urlhandle(&local_108);
  return CVar3;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}